

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

Options * __thiscall
restincurl::Options::Set<curl_slist*>(Options *this,CURLoption *opt,curl_slist **value)

{
  CURLcode err;
  CurlException *this_00;
  allocator local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  err = curl_easy_setopt(this->eh_->handle_,*opt,*value);
  if (err == CURLE_OK) {
    return this;
  }
  this_00 = (CurlException *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string((string *)&local_60,"Setting option ",&local_81);
  std::__cxx11::to_string(&local_80,*opt);
  std::operator+(&local_40,&local_60,&local_80);
  CurlException::CurlException(this_00,&local_40,err);
  __cxa_throw(this_00,&CurlException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Options& Set(const CURLoption& opt, const T& value) {
            const auto ret = curl_easy_setopt(eh_, opt, value);
            if (ret) {
                throw CurlException(
                    std::string("Setting option ") + std::to_string(opt), ret);
            }
            return *this;
        }